

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessStartJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  bool bVar1;
  ErrorCode aErrorCode;
  size_type sVar2;
  const_reference pvVar3;
  Error *aError;
  element_type *peVar4;
  ulong uVar5;
  StringArray *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  format_args args;
  string_view fmt;
  Error local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Error local_258;
  Error local_230;
  Error local_208;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  Error local_1b8;
  anon_class_1_0_00000001 local_17a;
  v10 local_179;
  v10 *local_178;
  size_t local_170;
  string local_168;
  Error local_148;
  byte local_119;
  undefined1 local_118 [7];
  bool connectOnly;
  string existingCommissionerId;
  undefined1 local_f0 [6];
  uint16_t port;
  Error error;
  Expression *aExpr_local;
  CommissionerAppPtr *aCommissioner_local;
  Interpreter *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  error.mMessage.field_2._8_8_ = aExpr;
  Error::Error((Error *)local_f0);
  std::__cxx11::string::string((string *)local_118);
  local_119 = 0;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)error.mMessage.field_2._8_8_);
  if (sVar2 < 3) {
    ProcessStartJob::anon_class_1_0_00000001::operator()(&local_17a);
    local_58 = &local_178;
    local_60 = &local_179;
    bVar6 = ::fmt::v10::operator()(local_60);
    local_170 = bVar6.size_;
    local_178 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_168;
    local_78 = local_178;
    sStack_70 = local_170;
    local_50 = &local_78;
    local_88 = local_178;
    local_80 = local_170;
    local_48 = local_88;
    sStack_40 = local_80;
    local_a8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = local_a8;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_168,local_88,fmt,args);
    Error::Error(&local_148,kInvalidArgs,&local_168);
    Error::operator=((Error *)local_f0,&local_148);
    Error::~Error(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)error.mMessage.field_2._8_8_,2);
    utils::ParseInteger<unsigned_short>
              (&local_1b8,(unsigned_short *)(existingCommissionerId.field_2._M_local_buf + 0xe),
               pvVar3);
    aError = Error::operator=((Error *)local_f0,&local_1b8);
    it._M_current._4_4_ = 0;
    bVar1 = commissioner::operator!=(aError,(ErrorCode *)((long)&it._M_current + 4));
    Error::~Error(&local_1b8);
    if (!bVar1) {
      this_00 = &(this->mContext).mCommandKeys;
      local_1d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this_00);
      local_1c8 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[15]>
                            (local_1d0,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_1d8,(char (*) [15])"--connect-only");
      local_1e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(this->mContext).mCommandKeys);
      bVar1 = __gnu_cxx::operator!=(&local_1c8,&local_1e0);
      if (bVar1) {
        local_119 = 1;
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)aCommissioner);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)error.mMessage.field_2._8_8_,1);
        (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[10])
                  (&local_208,peVar4,pvVar3,(ulong)(ushort)existingCommissionerId.field_2._14_2_);
        Error::operator=((Error *)local_f0,&local_208);
        Error::~Error(&local_208);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)aCommissioner);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)error.mMessage.field_2._8_8_,1);
        (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0xc])
                  (&local_230,peVar4,local_118,pvVar3,
                   (ulong)(ushort)existingCommissionerId.field_2._14_2_);
        Error::operator=((Error *)local_f0,&local_230);
        Error::~Error(&local_230);
      }
    }
  }
  if (((local_119 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    aErrorCode = Error::GetCode((Error *)local_f0);
    std::operator+(&local_278,"there is an existing active commissioner: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    Error::Error(&local_258,aErrorCode,&local_278);
    Error::operator=((Error *)local_f0,&local_258);
    Error::~Error(&local_258);
    std::__cxx11::string::~string((string *)&local_278);
  }
  Error::Error(&local_2a0,(Error *)local_f0);
  Value::Value(__return_storage_ptr__,&local_2a0);
  Error::~Error(&local_2a0);
  std::__cxx11::string::~string((string *)local_118);
  Error::~Error((Error *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStartJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Error       error;
    uint16_t    port;
    std::string existingCommissionerId;
    bool        connectOnly = false;

    VerifyOrExit(aExpr.size() >= 3, error = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(error = ParseInteger(port, aExpr[2]));

    {
        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--connect-only");

        if (it != mContext.mCommandKeys.end())
        {
            connectOnly = true;
            error       = aCommissioner->Connect(aExpr[1], port);
        }
        else
        {
            error = aCommissioner->Start(existingCommissionerId, aExpr[1], port);
        }
    }

exit:
    if (!connectOnly && !existingCommissionerId.empty())
    {
        error = Error{error.GetCode(), "there is an existing active commissioner: " + existingCommissionerId};
    }
    return error;
}